

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

DOMNodeList * __thiscall
xercesc_4_0::DOMDocumentImpl::getDeepNodeList
          (DOMDocumentImpl *this,DOMNode *rootNode,XMLCh *namespaceURI,XMLCh *localName)

{
  DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *this_00;
  int iVar1;
  undefined4 extraout_var;
  DOMDeepNodeListPoolTableBucketElem<xercesc_4_0::DOMDeepNodeListImpl> *pDVar2;
  undefined4 extraout_var_00;
  XMLSize_t elemId;
  DOMDeepNodeListImpl *pDVar3;
  XMLSize_t hashVal;
  XMLSize_t XStack_38;
  
  if (this->fNodeListPool ==
      (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)0x0) {
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,0x40);
    DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::
    DOMDeepNodeListPool((DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>
                         *)CONCAT44(extraout_var,iVar1),0x6d,false,0x80);
    this->fNodeListPool =
         (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)
         CONCAT44(extraout_var,iVar1);
  }
  pDVar2 = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::
           findBucketElem(this->fNodeListPool,rootNode,localName,namespaceURI,&XStack_38);
  if (pDVar2 == (DOMDeepNodeListPoolTableBucketElem<xercesc_4_0::DOMDeepNodeListImpl> *)0x0) {
    pDVar3 = (DOMDeepNodeListImpl *)0x0;
  }
  else {
    pDVar3 = pDVar2->fData;
  }
  if (pDVar3 == (DOMDeepNodeListImpl *)0x0) {
    this_00 = this->fNodeListPool;
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,0x40);
    DOMDeepNodeListImpl::DOMDeepNodeListImpl
              ((DOMDeepNodeListImpl *)CONCAT44(extraout_var_00,iVar1),rootNode,namespaceURI,
               localName);
    elemId = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::put
                       (this_00,rootNode,localName,namespaceURI,
                        (DOMDeepNodeListImpl *)CONCAT44(extraout_var_00,iVar1));
    pDVar3 = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::getById
                       (this->fNodeListPool,elemId);
  }
  return &pDVar3->super_DOMNodeList;
}

Assistant:

DOMNodeList *DOMDocumentImpl::getDeepNodeList(const DOMNode *rootNode,     //DOM Level 2
                                                   const XMLCh *namespaceURI,
                                                   const XMLCh *localName)
{
    if(!fNodeListPool) {
        fNodeListPool = new (this) DOMDeepNodeListPool<DOMDeepNodeListImpl>(109, false);
    }

    DOMDeepNodeListImpl* retList = fNodeListPool->getByKey(rootNode, localName, namespaceURI);
    if (!retList) {
        // the pool will adopt the DOMDeepNodeListImpl
        XMLSize_t id = fNodeListPool->put((void*) rootNode, (XMLCh*) localName, (XMLCh*) namespaceURI, new (this) DOMDeepNodeListImpl(rootNode, namespaceURI, localName));
        retList = fNodeListPool->getById(id);
    }

    return retList;
}